

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

size_t __thiscall
linq::IEnumerableCore<linq::IEnumerable<int_&>_>::Count
          (IEnumerableCore<linq::IEnumerable<int_&>_> *this)

{
  bool bVar1;
  size_t sVar2;
  iterator __begin0;
  iterator __end0;
  iterator iStack_88;
  iterator local_68;
  iterator local_48;
  
  begin(&iStack_88,this);
  end(&local_68,this);
  sVar2 = 0;
  while( true ) {
    iterator::iterator(&local_48,&local_68);
    bVar1 = iterator::operator!=(&iStack_88,&local_48);
    IEnumerable<int_&>::~IEnumerable(&local_48.source);
    if (!bVar1) break;
    (*(iStack_88.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_IState[3])();
    sVar2 = sVar2 + 1;
    iterator::operator++(&iStack_88);
  }
  IEnumerable<int_&>::~IEnumerable(&local_68.source);
  IEnumerable<int_&>::~IEnumerable(&iStack_88.source);
  return sVar2;
}

Assistant:

size_t Count() 
		{
			size_t count = 0; 
			
			for(const auto& _ : *this) 
				count++; 
			
			return count;
		}